

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseString(Parser *this,Value *val,bool use_string_pooling)

{
  Offset<flatbuffers::String> OVar1;
  char in_CL;
  undefined7 in_register_00000011;
  CheckedError *ce;
  uint16_t *this_00;
  string s;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)&(val->constant)._M_string_length);
  Expect(this,(int)val);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    this_00 = &val[6].type.fixed_length;
    if (in_CL == '\0') {
      OVar1 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                        ((FlatBufferBuilderImpl<false> *)this_00,&local_60);
      NumToString<unsigned_int>(&local_40,OVar1.o);
    }
    else {
      OVar1 = FlatBufferBuilderImpl<false>::CreateSharedString
                        ((FlatBufferBuilderImpl<false> *)this_00,local_60._M_dataplus._M_p,
                         local_60._M_string_length);
      NumToString<unsigned_int>(&local_40,OVar1.o);
    }
    std::__cxx11::string::operator=
              ((string *)(CONCAT71(in_register_00000011,use_string_pooling) + 0x20),
               (string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  std::__cxx11::string::~string((string *)&local_60);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseString(Value &val, bool use_string_pooling) {
  auto s = attribute_;
  EXPECT(kTokenStringConstant);
  if (use_string_pooling) {
    val.constant = NumToString(builder_.CreateSharedString(s).o);
  } else {
    val.constant = NumToString(builder_.CreateString(s).o);
  }
  return NoError();
}